

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteArray *data)

{
  QDecompressHelper *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  QByteArray *data_00;
  long in_FS_OFFSET;
  Data *pDVar5;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->totalCompressedBytes = this->totalCompressedBytes + (data->d).size;
  QByteDataBuffer::append(&this->compressedDataBuffer,data);
  data_00 = QByteDataBuffer::operator[]
                      (&this->compressedDataBuffer,(this->compressedDataBuffer).buffers.d.size + -1)
  ;
  bVar4 = countInternal(this,data_00);
  if (!bVar4) {
    if (((this->errorStr).d.size == 0) &&
       (pQVar1 = (this->countHelper)._M_t.
                 super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>
                 .super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl,
       pQVar1 != (QDecompressHelper *)0x0)) {
      pDVar5 = (pQVar1->errorStr).d.d;
      pcVar2 = *(char16_t **)((long)&(pQVar1->errorStr).d + 8);
      qVar3 = *(qsizetype *)((long)&(pQVar1->errorStr).d + 0x10);
      if (pDVar5 == (Data *)0x0) {
        local_28.size = 0;
        pDVar5 = (Data *)0x0;
      }
      else {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_28.size = (this->errorStr).d.size;
      }
      local_28.d = (this->errorStr).d.d;
      local_28.ptr = (this->errorStr).d.ptr;
      (this->errorStr).d.d = pDVar5;
      (this->errorStr).d.ptr = pcVar2;
      (this->errorStr).d.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    }
    clear(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDecompressHelper::feed(QByteArray &&data)
{
    Q_ASSERT(contentEncoding != None);
    totalCompressedBytes += data.size();
    compressedDataBuffer.append(std::move(data));
    if (!countInternal(compressedDataBuffer[compressedDataBuffer.bufferCount() - 1])) {
        if (errorStr.isEmpty() && countHelper)
            errorStr = countHelper->errorString();
        clear(); // If our counting brother failed then so will we :|
    }
}